

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

CovergroupDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::CovergroupDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::FunctionPortListSyntax*&,slang::syntax::SyntaxNode*&,slang::parsing::Token&,slang::syntax::SyntaxList<slang::syntax::MemberSyntax>const&,slang::parsing::Token&,slang::syntax::NamedBlockClauseSyntax*&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2,Token *args_3,FunctionPortListSyntax **args_4,
          SyntaxNode **args_5,Token *args_6,SyntaxList<slang::syntax::MemberSyntax> *args_7,
          Token *args_8,NamedBlockClauseSyntax **args_9)

{
  Token extends;
  Token covergroup;
  Token name;
  Token semi;
  Token endgroup;
  CovergroupDeclarationSyntax *this_00;
  
  this_00 = (CovergroupDeclarationSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((CovergroupDeclarationSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (CovergroupDeclarationSyntax *)allocateSlow(this,0xf0,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  covergroup.kind = args_1->kind;
  covergroup._2_1_ = args_1->field_0x2;
  covergroup.numFlags.raw = (args_1->numFlags).raw;
  covergroup.rawLen = args_1->rawLen;
  covergroup.info = args_1->info;
  extends.kind = args_2->kind;
  extends._2_1_ = args_2->field_0x2;
  extends.numFlags.raw = (args_2->numFlags).raw;
  extends.rawLen = args_2->rawLen;
  extends.info = args_2->info;
  endgroup.kind = args_8->kind;
  endgroup._2_1_ = args_8->field_0x2;
  endgroup.numFlags.raw = (args_8->numFlags).raw;
  endgroup.rawLen = args_8->rawLen;
  endgroup.info = args_8->info;
  semi.kind = args_6->kind;
  semi._2_1_ = args_6->field_0x2;
  semi.numFlags.raw = (args_6->numFlags).raw;
  semi.rawLen = args_6->rawLen;
  semi.info = args_6->info;
  name.kind = args_3->kind;
  name._2_1_ = args_3->field_0x2;
  name.numFlags.raw = (args_3->numFlags).raw;
  name.rawLen = args_3->rawLen;
  name.info = args_3->info;
  slang::syntax::CovergroupDeclarationSyntax::CovergroupDeclarationSyntax
            (this_00,args,covergroup,extends,name,*args_4,*args_5,semi,args_7,endgroup,*args_9);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }